

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

void __thiscall QHostInfoCache::clear(QHostInfoCache *this)

{
  QMutex *pQVar1;
  __pointer_type pQVar2;
  bool bVar3;
  
  pQVar1 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar3 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar3) goto LAB_001afb3b;
  }
  QBasicMutex::lockInternal();
LAB_001afb3b:
  QHashPrivate::Data<QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::Node>::clear
            (&(this->cache).d);
  (this->cache).total = 0;
  (this->cache).chain.next = &(this->cache).chain;
  (this->cache).chain.prev = &(this->cache).chain;
  LOCK();
  pQVar2 = (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar2 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar1);
    return;
  }
  return;
}

Assistant:

void QHostInfoCache::clear()
{
    QMutexLocker locker(&this->mutex);
    cache.clear();
}